

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *this_00;
  int iVar1;
  bool bVar2;
  TestSuite *this_01;
  TestSuite *new_test_suite;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  allocator<char> local_91;
  TestSuite *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_88._8_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88._0_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_78 + 8),test_suite_name,(allocator<char> *)&local_90);
  std::__cxx11::string::string
            (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_78 + 8));
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)local_78,
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)(local_88 + 8),(TestSuiteNameIs *)local_88);
  this_00 = &this->test_suites_;
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  if (local_78 ==
      (undefined1  [8])
      (this_00->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    this_01 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite(this_01,test_suite_name,type_param,set_up_tc,tear_down_tc);
    local_90 = this_01;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_78 + 8),test_suite_name,&local_91);
    bVar2 = UnitTestOptions::MatchesFilter((string *)(local_78 + 8),"*DeathTest:*DeathTest/*");
    std::__cxx11::string::~string((string *)(local_78 + 8));
    if (bVar2) {
      iVar1 = this->last_death_test_suite_;
      this->last_death_test_suite_ = iVar1 + 1;
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                (this_00,(const_iterator)
                         ((this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar1 + 1),&local_90);
    }
    else {
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                (this_00,&local_90);
    }
    local_70._M_dataplus._M_p._0_4_ =
         (undefined4)
         ((ulong)((long)(this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->test_suite_indices_,(int *)(local_78 + 8));
  }
  else {
    local_90 = *(pointer)((long)local_78 - 8);
  }
  return local_90;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test suite?
  if (internal::UnitTestOptions::MatchesFilter(test_suite_name,
                                               kDeathTestSuiteFilter)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}